

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

opj_tgt_tree_t * tgt_create(int numleafsh,int numleafsv)

{
  opj_tgt_node *poVar1;
  int iVar2;
  opj_tgt_tree_t *__ptr;
  opj_tgt_node_t *poVar3;
  OPJ_UINT32 *pOVar4;
  int iVar5;
  opj_tgt_node *poVar6;
  uint uVar7;
  uint uVar8;
  opj_tgt_node_t *poVar9;
  uint uVar10;
  uint uVar11;
  opj_tgt_node *poVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int nplv [32];
  int nplh [32];
  uint local_138 [32];
  int local_b8 [34];
  
  __ptr = (opj_tgt_tree_t *)malloc(0x20);
  if (__ptr != (opj_tgt_tree_t *)0x0) {
    __ptr->numleafsh = numleafsh;
    __ptr->numleafsv = numleafsv;
    lVar14 = -1;
    iVar2 = numleafsv;
    uVar8 = 0;
    local_b8[0] = numleafsh;
    iVar5 = numleafsh;
    do {
      uVar7 = uVar8;
      iVar15 = iVar2 * iVar5;
      iVar5 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
      local_b8[lVar14 + 2] = iVar5;
      iVar2 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
      local_b8[lVar14 + -0x1e] = iVar2;
      uVar8 = uVar7 + iVar15;
      lVar14 = lVar14 + 1;
    } while (1 < iVar15);
    __ptr->numnodes = uVar8;
    local_138[0] = numleafsv;
    if (uVar8 != 0) {
      poVar3 = (opj_tgt_node_t *)calloc((ulong)uVar8,0x18);
      __ptr->nodes = poVar3;
      if (poVar3 != (opj_tgt_node_t *)0x0) {
        poVar9 = poVar3;
        if (lVar14 != 0) {
          poVar6 = poVar3 + (uint)(numleafsv * numleafsh);
          lVar13 = 0;
          poVar12 = poVar6;
          do {
            uVar8 = local_138[lVar13];
            if (0 < (int)uVar8) {
              iVar2 = local_b8[lVar13];
              uVar10 = 0;
              do {
                uVar11 = iVar2 + 2;
                if (0 < iVar2) {
                  do {
                    poVar9->parent = poVar12;
                    if (uVar11 == 3) {
                      poVar12 = poVar12 + 1;
                      poVar9 = poVar9 + 1;
                      break;
                    }
                    poVar9[1].parent = poVar12;
                    poVar9 = poVar9 + 2;
                    poVar12 = poVar12 + 1;
                    uVar11 = uVar11 - 2;
                  } while (2 < uVar11);
                }
                poVar1 = poVar6 + iVar2;
                if (uVar10 == uVar8 - 1 || (uVar10 & 1) != 0) {
                  poVar1 = poVar12;
                  poVar6 = poVar12;
                }
                poVar12 = poVar6;
                poVar6 = poVar1;
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar8);
            }
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
        }
        poVar9->parent = (opj_tgt_node *)0x0;
        pOVar4 = &poVar3->known;
        iVar15 = uVar7 + iVar15;
        do {
          *(undefined8 *)(pOVar4 + -2) = 999;
          *pOVar4 = 0;
          pOVar4 = pOVar4 + 6;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create(int numleafsh, int numleafsv) {
	int nplh[32];
	int nplv[32];
	opj_tgt_node_t *node = NULL;
	opj_tgt_node_t *parentnode = NULL;
	opj_tgt_node_t *parentnode0 = NULL;
	opj_tgt_tree_t *tree = NULL;
	int i, j, k;
	int numlvls;
	int n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) return NULL;
	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);
	
	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		return NULL;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		opj_free(tree);
		return NULL;
	}

	node = tree->nodes;
	parentnode = &tree->nodes[tree->numleafsh * tree->numleafsv];
	parentnode0 = parentnode;
	
	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = parentnode;
				++node;
				if (--k >= 0) {
					node->parent = parentnode;
					++node;
				}
				++parentnode;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				parentnode0 = parentnode;
			} else {
				parentnode = parentnode0;
				parentnode0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	
	tgt_reset(tree);
	
	return tree;
}